

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushFont(ImFont *font)

{
  int *piVar1;
  ImFontAtlas *pIVar2;
  ImFont **ppIVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImFont **__dest;
  int iVar6;
  int iVar7;
  
  pIVar4 = GImGui;
  if ((font == (ImFont *)0x0) && (font = (GImGui->IO).FontDefault, font == (ImFont *)0x0)) {
    pIVar2 = (GImGui->IO).Fonts;
    if ((pIVar2->Fonts).Size < 1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                    ,0x4e6,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
    }
    font = *(pIVar2->Fonts).Data;
  }
  SetCurrentFont(font);
  iVar5 = (pIVar4->FontStack).Size;
  if (iVar5 == (pIVar4->FontStack).Capacity) {
    if (iVar5 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar5 / 2 + iVar5;
    }
    iVar7 = iVar5 + 1;
    if (iVar5 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImFont **)(*GImAllocatorAllocFunc)((long)iVar7 << 3,GImAllocatorUserData);
    ppIVar3 = (pIVar4->FontStack).Data;
    if (ppIVar3 != (ImFont **)0x0) {
      memcpy(__dest,ppIVar3,(long)(pIVar4->FontStack).Size << 3);
      ppIVar3 = (pIVar4->FontStack).Data;
      if ((ppIVar3 != (ImFont **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
    }
    (pIVar4->FontStack).Data = __dest;
    (pIVar4->FontStack).Capacity = iVar7;
    iVar5 = (pIVar4->FontStack).Size;
  }
  else {
    __dest = (pIVar4->FontStack).Data;
  }
  __dest[iVar5] = font;
  (pIVar4->FontStack).Size = (pIVar4->FontStack).Size + 1;
  ImDrawList::PushTextureID(pIVar4->CurrentWindow->DrawList,font->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}